

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void MIR_finish_func(MIR_context_t ctx)

{
  uint uVar1;
  char *pcVar2;
  MIR_item_t_conflict func_item;
  MIR_op_t obj;
  char *pcVar3;
  MIR_context_t ctx_00;
  int iVar4;
  MIR_op_mode_t MVar5;
  MIR_error_func_t p_Var6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  MIR_op_t *ops;
  MIR_insn_t_conflict insn_00;
  MIR_op_mode_t local_194;
  MIR_op_t local_168;
  MIR_op_t local_138;
  MIR_op_t local_108;
  MIR_op_t local_d8;
  undefined8 uStack_a8;
  MIR_op_t op;
  ulong local_70;
  size_t i_1;
  int can_be_out_p;
  int out_p;
  reg_desc_t *rd;
  MIR_op_mode_t expected_mode;
  MIR_op_mode_t mode;
  size_t actual_nops;
  size_t i;
  int jret_p;
  int ret_p;
  char *func_name;
  MIR_insn_t_conflict pMStack_28;
  MIR_insn_code_t code;
  MIR_insn_t_conflict prev_insn;
  MIR_insn_t_conflict insn;
  MIR_context_t pMStack_10;
  int expr_p;
  MIR_context_t ctx_local;
  
  insn._4_4_ = 1;
  i._4_4_ = 0;
  i._0_4_ = 0;
  pMStack_10 = ctx;
  if (ctx->curr_func == (MIR_func_t)0x0) {
    p_Var6 = MIR_get_error_func(ctx);
    (*p_Var6)(MIR_no_func_error,"finish of non-existing function");
  }
  _jret_p = pMStack_10->curr_func->name;
  if (((pMStack_10->curr_func->vararg_p != '\0') || (pMStack_10->curr_func->nargs != 0)) ||
     (pMStack_10->curr_func->nres != 1)) {
    insn._4_4_ = 0;
  }
  prev_insn = DLIST_MIR_insn_t_head(&pMStack_10->curr_func->insns);
  do {
    if (prev_insn == (MIR_insn_t_conflict)0x0) {
      if (((i._4_4_ == 0) && ((int)i == 0)) &&
         ((prev_insn = DLIST_MIR_insn_t_tail(&pMStack_10->curr_func->insns),
          prev_insn == (MIR_insn_t_conflict)0x0 ||
          ((int)*(undefined8 *)&prev_insn->field_0x18 != 0x76)))) {
        VARR_MIR_op_ttrunc(pMStack_10->temp_ops,0);
        for (local_70 = 0; ctx_00 = pMStack_10, local_70 < pMStack_10->curr_func->nres;
            local_70 = local_70 + 1) {
          if (pMStack_10->curr_func->res_types[local_70] == MIR_T_F) {
            MIR_new_float_op(&local_d8,pMStack_10,0.0);
            memcpy(&uStack_a8,&local_d8,0x30);
          }
          else if (pMStack_10->curr_func->res_types[local_70] == MIR_T_D) {
            MIR_new_double_op(&local_108,pMStack_10,0.0);
            memcpy(&uStack_a8,&local_108,0x30);
          }
          else if (pMStack_10->curr_func->res_types[local_70] == MIR_T_LD) {
            MIR_new_ldouble_op(&local_138,pMStack_10,(longdouble)0);
            memcpy(&uStack_a8,&local_138,0x30);
          }
          else {
            MIR_new_int_op(&local_168,pMStack_10,0);
            memcpy(&uStack_a8,&local_168,0x30);
          }
          obj._8_2_ = (short)op.data;
          obj.data = (void *)uStack_a8;
          obj._10_6_ = (int6)((ulong)op.data >> 0x10);
          obj.u.i = op._8_8_;
          obj.u._8_8_ = op.u.i;
          obj.u._16_8_ = op.u.str.s;
          obj.u.mem.disp = op.u._16_8_;
          VARR_MIR_op_tpush(pMStack_10->temp_ops,obj);
        }
        func_item = pMStack_10->curr_func->func_item;
        uVar1 = pMStack_10->curr_func->nres;
        ops = VARR_MIR_op_taddr(pMStack_10->temp_ops);
        insn_00 = MIR_new_insn_arr(ctx_00,MIR_RET,(ulong)uVar1,ops);
        MIR_append_insn(ctx_00,func_item,insn_00);
      }
      pMStack_10->curr_func->expr_p = (char)insn._4_4_;
      pMStack_10->curr_func->jret_p = (char)(int)i;
      pMStack_10->curr_func = (MIR_func_t)0x0;
      return;
    }
    _expected_mode = MIR_insn_nops(pMStack_10,prev_insn);
    func_name._4_4_ = (MIR_insn_code_t)*(undefined8 *)&prev_insn->field_0x18;
    if (func_name._4_4_ == MIR_RET) {
      i._4_4_ = 1;
    }
    if (func_name._4_4_ == MIR_JRET) {
      i._0_4_ = 1;
    }
    if ((func_name._4_4_ == MIR_PHI) || (func_name._4_4_ == MIR_USE)) {
      pMStack_10->curr_func = (MIR_func_t)0x0;
      p_Var6 = MIR_get_error_func(pMStack_10);
      (*p_Var6)(MIR_vararg_func_error,"use or phi can be used only internally");
    }
    if ((pMStack_10->curr_func->vararg_p == '\0') && (func_name._4_4_ == MIR_VA_START)) {
      pMStack_10->curr_func = (MIR_func_t)0x0;
      p_Var6 = MIR_get_error_func(pMStack_10);
      (*p_Var6)(MIR_vararg_func_error,"va_start is not in vararg function");
    }
    if ((func_name._4_4_ == MIR_JRET) && (pMStack_10->curr_func->nres != 0)) {
      pMStack_10->curr_func = (MIR_func_t)0x0;
      p_Var6 = MIR_get_error_func(pMStack_10);
      (*p_Var6)(MIR_vararg_func_error,
                "func %s: in insn \'%s\': function should not have results in this case",_jret_p,
                insn_descs[func_name._4_4_].name);
    }
    if (((func_name._4_4_ == MIR_JRET) && (i._4_4_ != 0)) ||
       ((func_name._4_4_ == MIR_RET && ((int)i != 0)))) {
      pMStack_10->curr_func = (MIR_func_t)0x0;
      p_Var6 = MIR_get_error_func(pMStack_10);
      (*p_Var6)(MIR_vararg_func_error,"func %s: mix of RET and JRET insns",_jret_p);
    }
    if ((func_name._4_4_ == MIR_RET) && (_expected_mode != pMStack_10->curr_func->nres)) {
      pMStack_10->curr_func = (MIR_func_t)0x0;
      p_Var6 = MIR_get_error_func(pMStack_10);
      (*p_Var6)(MIR_vararg_func_error,
                "func %s: in instruction \'%s\': number of operands in return does not correspond number of function returns. Expected %d, got %d"
                ,_jret_p,insn_descs[func_name._4_4_].name,(ulong)pMStack_10->curr_func->nres,
                _expected_mode);
    }
    iVar4 = MIR_call_code_p(func_name._4_4_);
    if (iVar4 == 0) {
      if ((((func_name._4_4_ == MIR_BO) || (func_name._4_4_ == MIR_UBO)) ||
          (func_name._4_4_ == MIR_BNO)) || (func_name._4_4_ == MIR_UBNO)) {
        pMStack_28 = DLIST_MIR_insn_t_prev(prev_insn);
        while (((pMStack_28 != (MIR_insn_t_conflict)0x0 &&
                ((int)*(undefined8 *)&pMStack_28->field_0x18 == 0)) &&
               (((ulong)pMStack_28[1].insn_link.prev & 0xff) == 1))) {
          pMStack_28 = DLIST_MIR_insn_t_prev(pMStack_28);
        }
        if ((pMStack_28 == (MIR_insn_t_conflict)0x0) ||
           (iVar4 = MIR_overflow_insn_code_p
                              ((MIR_insn_code_t)*(undefined8 *)&pMStack_28->field_0x18), iVar4 == 0)
           ) {
          p_Var6 = MIR_get_error_func(pMStack_10);
          (*p_Var6)(MIR_invalid_insn_error,
                    "func %s: instruction \'%s\' has no previous overflow insn separated only by stores and reg moves"
                    ,_jret_p,insn_descs[func_name._4_4_].name);
        }
        if (((func_name._4_4_ == MIR_UBO) || (func_name._4_4_ == MIR_UBNO)) &&
           (((int)*(undefined8 *)&pMStack_28->field_0x18 == 0x72 ||
            ((int)*(undefined8 *)&pMStack_28->field_0x18 == 0x73)))) {
          p_Var6 = MIR_get_error_func(pMStack_10);
          (*p_Var6)(MIR_invalid_insn_error,
                    "func %s: unsigned overflow branch \'%s\' consumes flag of signed overflow insn \'%s\'"
                    ,_jret_p,insn_descs[func_name._4_4_].name,
                    insn_descs[*(ulong *)&pMStack_28->field_0x18 & 0xffffffff].name);
        }
        if (((func_name._4_4_ == MIR_BO) || (func_name._4_4_ == MIR_BNO)) &&
           (((int)*(undefined8 *)&pMStack_28->field_0x18 == 0x74 ||
            ((int)*(undefined8 *)&pMStack_28->field_0x18 == 0x75)))) {
          p_Var6 = MIR_get_error_func(pMStack_10);
          (*p_Var6)(MIR_invalid_insn_error,
                    "func %s: signed overflow branch \'%s\' consumes flag of unsigned overflow insn \'%s\'"
                    ,_jret_p,insn_descs[func_name._4_4_].name,
                    insn_descs[*(ulong *)&pMStack_28->field_0x18 & 0xffffffff].name);
        }
      }
    }
    else {
      insn._4_4_ = 0;
    }
    for (actual_nops = 0; actual_nops < _expected_mode; actual_nops = actual_nops + 1) {
      if ((func_name._4_4_ == MIR_UNSPEC) && (actual_nops == 0)) {
        if ((*(ushort *)&prev_insn->ops[0].field_0x8 & 0xff) != 3) {
          __assert_fail("insn->ops[i].mode == MIR_OP_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x642,"void MIR_finish_func(MIR_context_t)");
        }
      }
      else {
        iVar4 = MIR_call_code_p(func_name._4_4_);
        if (iVar4 == 0) {
LAB_001131e1:
          if ((func_name._4_4_ == MIR_VA_ARG) && (actual_nops == 2)) {
            if ((undefined1  [32])((undefined1  [32])prev_insn[1].ops[0].u & (undefined1  [32])0xff)
                != (undefined1  [32])0xa) {
              __assert_fail("insn->ops[i].mode == MIR_OP_MEM",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x652,"void MIR_finish_func(MIR_context_t)");
            }
          }
          else {
            if (func_name._4_4_ == MIR_SWITCH) {
              i_1._4_4_ = 0;
              rd._0_4_ = MIR_OP_LABEL;
              if (actual_nops == 0) {
                rd._0_4_ = MIR_OP_INT;
              }
            }
            else if (func_name._4_4_ == MIR_RET) {
              i_1._4_4_ = 0;
              rd._0_4_ = type2mode(pMStack_10->curr_func->res_types[actual_nops]);
            }
            else {
              rd._0_4_ = MIR_insn_op_mode(pMStack_10,prev_insn,actual_nops,(int *)((long)&i_1 + 4));
            }
            i_1._0_4_ = 1;
            switch(prev_insn->ops[actual_nops].field_0x8) {
            case 1:
              _can_be_out_p =
                   find_rd_by_reg(pMStack_10,prev_insn->ops[actual_nops].u.reg,pMStack_10->curr_func
                                 );
              if ((_can_be_out_p == (reg_desc_t *)0x0) ||
                 (prev_insn->ops[actual_nops].u.reg != _can_be_out_p->reg)) {
                __assert_fail("rd != ((void*)0) && insn->ops[i].u.reg == rd->reg",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0x662,"void MIR_finish_func(MIR_context_t)");
              }
              rd._4_4_ = type2mode(_can_be_out_p->type);
              break;
            case 2:
            case 0xb:
              insn._4_4_ = 0;
              rd._4_4_ = (MIR_op_mode_t)rd;
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x692,"void MIR_finish_func(MIR_context_t)");
            default:
              i_1._0_4_ = 0;
              rd._4_4_ = (MIR_op_mode_t)(*(ushort *)&prev_insn->ops[actual_nops].field_0x8 & 0xff);
              if ((rd._4_4_ == MIR_OP_REF) || (rd._4_4_ == MIR_OP_STR)) {
                rd._4_4_ = MIR_OP_INT;
              }
              break;
            case 10:
              insn._4_4_ = 0;
              iVar4 = wrong_type_p((uint)*(byte *)&prev_insn->ops[actual_nops].u);
              if ((iVar4 != 0) &&
                 ((iVar4 = MIR_all_blk_type_p((uint)*(byte *)&prev_insn->ops[actual_nops].u),
                  iVar4 == 0 || (iVar4 = MIR_call_code_p(func_name._4_4_), iVar4 == 0)))) {
                pMStack_10->curr_func = (MIR_func_t)0x0;
                p_Var6 = MIR_get_error_func(pMStack_10);
                (*p_Var6)(MIR_wrong_type_error,"func %s: in instruction \'%s\': wrong type memory",
                          _jret_p,insn_descs[func_name._4_4_].name);
              }
              iVar4 = MIR_all_blk_type_p((uint)*(byte *)&prev_insn->ops[actual_nops].u);
              if ((iVar4 != 0) && (prev_insn->ops[actual_nops].u.mem.disp < 0)) {
                pMStack_10->curr_func = (MIR_func_t)0x0;
                p_Var6 = MIR_get_error_func(pMStack_10);
                (*p_Var6)(MIR_wrong_type_error,
                          "func %s: in instruction \'%s\': block type memory with disp < 0",_jret_p,
                          insn_descs[func_name._4_4_].name);
              }
              if (prev_insn->ops[actual_nops].u.mem.base != 0) {
                _can_be_out_p =
                     find_rd_by_reg(pMStack_10,prev_insn->ops[actual_nops].u.mem.base,
                                    pMStack_10->curr_func);
                if ((_can_be_out_p == (reg_desc_t *)0x0) ||
                   (prev_insn->ops[actual_nops].u.mem.base != _can_be_out_p->reg)) {
                  __assert_fail("rd != ((void*)0) && insn->ops[i].u.mem.base == rd->reg",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                ,0x676,"void MIR_finish_func(MIR_context_t)");
                }
                MVar5 = type2mode(_can_be_out_p->type);
                if (MVar5 != MIR_OP_INT) {
                  pMStack_10->curr_func = (MIR_func_t)0x0;
                  p_Var6 = MIR_get_error_func(pMStack_10);
                  (*p_Var6)(MIR_reg_type_error,
                            "func %s: in instruction \'%s\': base reg of non-integer type for operand #%d"
                            ,_jret_p,insn_descs[func_name._4_4_].name,actual_nops + 1);
                }
              }
              if (prev_insn->ops[actual_nops].u.mem.index != 0) {
                _can_be_out_p =
                     find_rd_by_reg(pMStack_10,prev_insn->ops[actual_nops].u.mem.index,
                                    pMStack_10->curr_func);
                if ((_can_be_out_p == (reg_desc_t *)0x0) ||
                   (prev_insn->ops[actual_nops].u.mem.index != _can_be_out_p->reg)) {
                  __assert_fail("rd != ((void*)0) && insn->ops[i].u.mem.index == rd->reg",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                ,0x682,"void MIR_finish_func(MIR_context_t)");
                }
                MVar5 = type2mode(_can_be_out_p->type);
                if (MVar5 != MIR_OP_INT) {
                  pMStack_10->curr_func = (MIR_func_t)0x0;
                  p_Var6 = MIR_get_error_func(pMStack_10);
                  (*p_Var6)(MIR_reg_type_error,
                            "func %s: in instruction \'%s\': index reg of non-integer type for operand #%d"
                            ,_jret_p,insn_descs[func_name._4_4_].name,actual_nops + 1);
                }
              }
              rd._4_4_ = type2mode((uint)*(byte *)&prev_insn->ops[actual_nops].u);
            }
            *(ushort *)&prev_insn->ops[actual_nops].field_0x8 =
                 *(ushort *)&prev_insn->ops[actual_nops].field_0x8 & 0xff | (short)rd._4_4_ << 8;
            if (((rd._4_4_ == MIR_OP_UNDEF) &&
                ((*(ushort *)&prev_insn->ops[actual_nops].field_0x8 & 0xff) == 10)) &&
               (((func_name._4_4_ == MIR_VA_START && (actual_nops == 0)) ||
                ((((func_name._4_4_ == MIR_VA_ARG || (func_name._4_4_ == MIR_VA_BLOCK_ARG)) &&
                  (actual_nops == 1)) || ((func_name._4_4_ == MIR_VA_END && (actual_nops == 1)))))))
               ) {
              *(ushort *)&prev_insn->ops[actual_nops].field_0x8 =
                   *(ushort *)&prev_insn->ops[actual_nops].field_0x8 & 0xff |
                   (short)(MIR_op_mode_t)rd << 8;
            }
            else if ((MIR_op_mode_t)rd == MIR_OP_REG) {
              if (((*(ushort *)&prev_insn->ops[actual_nops].field_0x8 & 0xff) != 1) &&
                 ((*(ushort *)&prev_insn->ops[actual_nops].field_0x8 & 0xff) != 2)) {
                p_Var6 = MIR_get_error_func(pMStack_10);
                pcVar3 = _jret_p;
                pcVar2 = insn_descs[func_name._4_4_].name;
                lVar7 = actual_nops + 1;
                pcVar8 = mode_str((uint)(*(ushort *)&prev_insn->ops[actual_nops].field_0x8 & 0xff));
                (*p_Var6)(MIR_op_mode_error,
                          "func %s: in instruction \'%s\': expected reg for operand #%d. Got \'%s\'"
                          ,pcVar3,pcVar2,lVar7,pcVar8);
              }
            }
            else if ((MIR_op_mode_t)rd != MIR_OP_UNDEF) {
              if (rd._4_4_ == MIR_OP_UINT) {
                local_194 = MIR_OP_INT;
              }
              else {
                local_194 = rd._4_4_;
              }
              if (local_194 != (MIR_op_mode_t)rd) {
                pMStack_10->curr_func = (MIR_func_t)0x0;
                p_Var6 = MIR_get_error_func(pMStack_10);
                pcVar3 = _jret_p;
                pcVar2 = insn_descs[func_name._4_4_].name;
                lVar7 = actual_nops + 1;
                pcVar8 = mode_str(rd._4_4_);
                pcVar9 = mode_str((MIR_op_mode_t)rd);
                (*p_Var6)(MIR_op_mode_error,
                          "func %s: in instruction \'%s\': unexpected operand mode for operand #%d. Got \'%s\', expected \'%s\'"
                          ,pcVar3,pcVar2,lVar7,pcVar8,pcVar9);
              }
            }
            if ((i_1._4_4_ != 0) && ((int)i_1 == 0)) {
              pMStack_10->curr_func = (MIR_func_t)0x0;
              p_Var6 = MIR_get_error_func(pMStack_10);
              (*p_Var6)(MIR_out_op_error,
                        "func %s; in instruction \'%s\': wrong operand #%d for insn output",_jret_p,
                        insn_descs[func_name._4_4_].name,actual_nops + 1);
            }
          }
        }
        else if (actual_nops == 0) {
          if (((*(ushort *)&prev_insn->ops[0].field_0x8 & 0xff) != 8) ||
             ((prev_insn->ops[0].u.ref)->item_type != MIR_proto_item)) {
            __assert_fail("insn->ops[i].mode == MIR_OP_REF && insn->ops[i].u.ref->item_type == MIR_proto_item"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x647,"void MIR_finish_func(MIR_context_t)");
          }
        }
        else {
          if ((actual_nops != 1) || (((ulong)prev_insn[1].insn_link.prev & 0xff) != 8))
          goto LAB_001131e1;
          if ((((*(int *)&(prev_insn[1].insn_link.next)->ops[0].data != 2) &&
               (*(int *)&(prev_insn[1].insn_link.next)->ops[0].data != 3)) &&
              (*(int *)&(prev_insn[1].insn_link.next)->ops[0].data != 4)) &&
             (*(int *)&(prev_insn[1].insn_link.next)->ops[0].data != 0)) {
            __assert_fail("insn->ops[i].u.ref->item_type == MIR_import_item || insn->ops[i].u.ref->item_type == MIR_export_item || insn->ops[i].u.ref->item_type == MIR_forward_item || insn->ops[i].u.ref->item_type == MIR_func_item"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x64d,"void MIR_finish_func(MIR_context_t)");
          }
        }
      }
    }
    prev_insn = DLIST_MIR_insn_t_next(prev_insn);
  } while( true );
}

Assistant:

void MIR_finish_func (MIR_context_t ctx) {
  int expr_p = TRUE;
  MIR_insn_t insn, prev_insn;
  MIR_insn_code_t code;
  const char *func_name;
  int ret_p = FALSE, jret_p = FALSE;

  if (curr_func == NULL)
    MIR_get_error_func (ctx) (MIR_no_func_error, "finish of non-existing function");
  func_name = curr_func->name;
  if (curr_func->vararg_p || curr_func->nargs != 0 || curr_func->nres != 1) expr_p = FALSE;
  for (insn = DLIST_HEAD (MIR_insn_t, curr_func->insns); insn != NULL;
       insn = DLIST_NEXT (MIR_insn_t, insn)) {
    size_t i, actual_nops = MIR_insn_nops (ctx, insn);
    MIR_op_mode_t mode, expected_mode;
    reg_desc_t *rd;
    int out_p, can_be_out_p;

    code = insn->code;
    if (code == MIR_RET) ret_p = TRUE;
    if (code == MIR_JRET) jret_p = TRUE;
    if (code == MIR_PHI || code == MIR_USE) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "use or phi can be used only internally");
    } else if (!curr_func->vararg_p && code == MIR_VA_START) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "va_start is not in vararg function");
    } else if (code == MIR_JRET && curr_func->nres != 0) {
      curr_func = NULL;
      MIR_get_error_func (
        ctx) (MIR_vararg_func_error,
              "func %s: in insn '%s': function should not have results in this case", func_name,
              insn_descs[code].name);
    } else if ((code == MIR_JRET && ret_p) || (code == MIR_RET && jret_p)) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "func %s: mix of RET and JRET insns",
                                func_name);
    } else if (code == MIR_RET && actual_nops != curr_func->nres) {
      curr_func = NULL;
      MIR_get_error_func (
        ctx) (MIR_vararg_func_error,
              "func %s: in instruction '%s': number of operands in return does not "
              "correspond number of function returns. Expected %d, got %d",
              func_name, insn_descs[code].name, curr_func->nres, actual_nops);
    } else if (MIR_call_code_p (code)) {
      expr_p = FALSE;
    } else if (code == MIR_BO || code == MIR_UBO || code == MIR_BNO || code == MIR_UBNO) {
      for (prev_insn = DLIST_PREV (MIR_insn_t, insn); prev_insn != NULL;
           prev_insn = DLIST_PREV (MIR_insn_t, prev_insn))
        if (prev_insn->code != MIR_MOV || prev_insn->ops[1].mode != MIR_OP_REG) break;
      if (prev_insn == NULL || !MIR_overflow_insn_code_p (prev_insn->code))
        MIR_get_error_func (ctx) (MIR_invalid_insn_error,
                                  "func %s: instruction '%s' has no previous overflow insn "
                                  "separated only by stores and reg moves",
                                  func_name, insn_descs[code].name);
      else if ((code == MIR_UBO || code == MIR_UBNO)
               && (prev_insn->code == MIR_MULO || prev_insn->code == MIR_MULOS))
        MIR_get_error_func (
          ctx) (MIR_invalid_insn_error,
                "func %s: unsigned overflow branch '%s' consumes flag of signed overflow insn '%s'",
                func_name, insn_descs[code].name, insn_descs[prev_insn->code].name);
      else if ((code == MIR_BO || code == MIR_BNO)
               && (prev_insn->code == MIR_UMULO || prev_insn->code == MIR_UMULOS))
        MIR_get_error_func (
          ctx) (MIR_invalid_insn_error,
                "func %s: signed overflow branch '%s' consumes flag of unsigned overflow insn '%s'",
                func_name, insn_descs[code].name, insn_descs[prev_insn->code].name);
    }
    for (i = 0; i < actual_nops; i++) {
      if (code == MIR_UNSPEC && i == 0) {
        mir_assert (insn->ops[i].mode == MIR_OP_INT);
        continue;
      } else if (MIR_call_code_p (code)) {
        if (i == 0) {
          mir_assert (insn->ops[i].mode == MIR_OP_REF
                      && insn->ops[i].u.ref->item_type == MIR_proto_item);
          continue; /* We checked the operand during insn creation -- skip the prototype */
        } else if (i == 1 && insn->ops[i].mode == MIR_OP_REF) {
          mir_assert (insn->ops[i].u.ref->item_type == MIR_import_item
                      || insn->ops[i].u.ref->item_type == MIR_export_item
                      || insn->ops[i].u.ref->item_type == MIR_forward_item
                      || insn->ops[i].u.ref->item_type == MIR_func_item);
          continue; /* We checked the operand during insn creation -- skip the func */
        }
      }
      if (code == MIR_VA_ARG && i == 2) {
        mir_assert (insn->ops[i].mode == MIR_OP_MEM);
        continue; /* We checked the operand during insn creation -- skip va_arg type  */
      }
      if (code == MIR_SWITCH) {
        out_p = FALSE;
        expected_mode = i == 0 ? MIR_OP_INT : MIR_OP_LABEL;
      } else if (code == MIR_RET) {
        out_p = FALSE;
        expected_mode = type2mode (curr_func->res_types[i]);
      } else {
        expected_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
      }
      can_be_out_p = TRUE;
      switch (insn->ops[i].mode) {
      case MIR_OP_REG:
        rd = find_rd_by_reg (ctx, insn->ops[i].u.reg, curr_func);
        mir_assert (rd != NULL && insn->ops[i].u.reg == rd->reg);
        mode = type2mode (rd->type);
        break;
      case MIR_OP_MEM:
        expr_p = FALSE;
        if (wrong_type_p (insn->ops[i].u.mem.type)
            && (!MIR_all_blk_type_p (insn->ops[i].u.mem.type) || !MIR_call_code_p (code))) {
          curr_func = NULL;
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "func %s: in instruction '%s': wrong type memory", func_name,
                                    insn_descs[code].name);
        }
        if (MIR_all_blk_type_p (insn->ops[i].u.mem.type) && insn->ops[i].u.mem.disp < 0) {
          curr_func = NULL;
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "func %s: in instruction '%s': block type memory with disp < 0",
                                    func_name, insn_descs[code].name);
        }
        if (insn->ops[i].u.mem.base != 0) {
          rd = find_rd_by_reg (ctx, insn->ops[i].u.mem.base, curr_func);
          mir_assert (rd != NULL && insn->ops[i].u.mem.base == rd->reg);
          if (type2mode (rd->type) != MIR_OP_INT) {
            curr_func = NULL;
            MIR_get_error_func (
              ctx) (MIR_reg_type_error,
                    "func %s: in instruction '%s': base reg of non-integer type for operand "
                    "#%d",
                    func_name, insn_descs[code].name, i + 1);
          }
        }
        if (insn->ops[i].u.mem.index != 0) {
          rd = find_rd_by_reg (ctx, insn->ops[i].u.mem.index, curr_func);
          mir_assert (rd != NULL && insn->ops[i].u.mem.index == rd->reg);
          if (type2mode (rd->type) != MIR_OP_INT) {
            curr_func = NULL;
            MIR_get_error_func (
              ctx) (MIR_reg_type_error,
                    "func %s: in instruction '%s': index reg of non-integer type for "
                    "operand #%d",
                    func_name, insn_descs[code].name, i + 1);
          }
        }
        mode = type2mode (insn->ops[i].u.mem.type);
        break;
      case MIR_OP_VAR:
      case MIR_OP_VAR_MEM:
        expr_p = FALSE;
        mode = expected_mode;
        mir_assert (FALSE); /* Should not be here */
        break;
      default:
        can_be_out_p = FALSE;
        mode = insn->ops[i].mode;
        if (mode == MIR_OP_REF || mode == MIR_OP_STR) mode = MIR_OP_INT; /* just an address */
        break;
      }
      insn->ops[i].value_mode = mode;
      if (mode == MIR_OP_UNDEF && insn->ops[i].mode == MIR_OP_MEM
          && ((code == MIR_VA_START && i == 0)
              || ((code == MIR_VA_ARG || code == MIR_VA_BLOCK_ARG) && i == 1)
              || (code == MIR_VA_END && i == 1))) { /* a special case: va_list as undef type mem */
        insn->ops[i].value_mode = expected_mode;
      } else if (expected_mode == MIR_OP_REG) {
        if (insn->ops[i].mode != MIR_OP_REG && insn->ops[i].mode != MIR_OP_VAR)
          MIR_get_error_func (
            ctx) (MIR_op_mode_error,
                  "func %s: in instruction '%s': expected reg for operand #%d. Got '%s'", func_name,
                  insn_descs[code].name, i + 1, mode_str (insn->ops[i].mode));
      } else if (expected_mode != MIR_OP_UNDEF
                 && (mode == MIR_OP_UINT ? MIR_OP_INT : mode) != expected_mode) {
        curr_func = NULL;
        MIR_get_error_func (
          ctx) (MIR_op_mode_error,
                "func %s: in instruction '%s': unexpected operand mode for operand #%d. Got "
                "'%s', expected '%s'",
                func_name, insn_descs[code].name, i + 1, mode_str (mode), mode_str (expected_mode));
      }
      if (out_p && !can_be_out_p) {
        curr_func = NULL;
        MIR_get_error_func (ctx) (MIR_out_op_error,
                                  "func %s; in instruction '%s': wrong operand #%d for insn output",
                                  func_name, insn_descs[code].name, i + 1);
      }
    }
  }
  if (!ret_p && !jret_p
      && ((insn = DLIST_TAIL (MIR_insn_t, curr_func->insns)) == NULL || insn->code != MIR_JMP)) {
    VARR_TRUNC (MIR_op_t, temp_ops, 0);
    for (size_t i = 0; i < curr_func->nres; i++) { /* add absent ret */
      MIR_op_t op;
      if (curr_func->res_types[i] == MIR_T_F)
        op = MIR_new_float_op (ctx, 0.0f);
      else if (curr_func->res_types[i] == MIR_T_D)
        op = MIR_new_double_op (ctx, 0.0);
      else if (curr_func->res_types[i] == MIR_T_LD)
        op = MIR_new_ldouble_op (ctx, 0.0);
      else
        op = MIR_new_int_op (ctx, 0);
      VARR_PUSH (MIR_op_t, temp_ops, op);
    }
    MIR_append_insn (ctx, curr_func->func_item,
                     MIR_new_insn_arr (ctx, MIR_RET, curr_func->nres,
                                       VARR_ADDR (MIR_op_t, temp_ops)));
  }
  curr_func->expr_p = expr_p;
  curr_func->jret_p = jret_p;
  curr_func = NULL;
}